

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeGetStepDirection(void *arkode_mem,sunrealtype *stepdir)

{
  sunrealtype *in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem ark_mem;
  sunrealtype local_28;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x934,"ARKodeGetStepDirection",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (in_RSI == (sunrealtype *)0x0) {
      arkProcessError(in_RDI,-0x16,0x93c,"ARKodeGetStepDirection",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                      ,"stepdir cannot be NULL");
    }
    if ((in_RDI->fixedstep == 0) && ((in_RDI->h != 0.0 || (NAN(in_RDI->h))))) {
      local_28 = in_RDI->h;
    }
    else {
      local_28 = in_RDI->hin;
    }
    *in_RSI = local_28;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKodeGetStepDirection(void* arkode_mem, sunrealtype* stepdir)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  if (stepdir == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "stepdir cannot be NULL");
  }

  *stepdir = (ark_mem->fixedstep || ark_mem->h == ZERO) ? ark_mem->hin
                                                        : ark_mem->h;
  return (ARK_SUCCESS);
}